

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

int __thiscall
ON_BinaryArchive::Read3dmInstanceDefinition
          (ON_BinaryArchive *this,ON_InstanceDefinition **ppInstanceDefinition)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  ON_InstanceDefinition *model_component;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  uint local_34;
  ON_Object *local_30;
  ON__INT64 local_28;
  
  bVar2 = Read3dmTableRecord(this,instance_definition_table,ppInstanceDefinition);
  if (!bVar2) {
    return 0;
  }
  local_34 = 0;
  local_28 = 0;
  bVar2 = BeginRead3dmBigChunk(this,&local_34,&local_28);
  if (bVar2) {
    if (local_34 != 0xffffffff) {
      if (local_34 == 0x20008076) {
        Internal_Increment3dmTableItemCount(this);
        local_30 = (ON_Object *)0x0;
        iVar3 = ReadObjectHelper(this,&local_30);
        pOVar1 = local_30;
        if (iVar3 != 0) {
          model_component = ON_InstanceDefinition::Cast(local_30);
          if (model_component != (ON_InstanceDefinition *)0x0) {
            EndRead3dmChunk(this,false);
            Internal_Read3dmUpdateManifest(this,&model_component->super_ON_ModelComponent);
            iVar3 = 1;
            goto LAB_003a3d16;
          }
          if (pOVar1 != (ON_Object *)0x0) {
            (*pOVar1->_vptr_ON_Object[4])(pOVar1);
          }
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2e32,"",
                   "ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table"
                  );
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2e36,"",
                   "ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table"
                  );
      }
    }
    EndRead3dmChunk(this,false);
  }
  iVar3 = 0;
  model_component = (ON_InstanceDefinition *)0x0;
LAB_003a3d16:
  *ppInstanceDefinition = model_component;
  return iVar3;
}

Assistant:

int ON_BinaryArchive::Read3dmInstanceDefinition( ON_InstanceDefinition** ppInstanceDefinition )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::instance_definition_table, (void**)ppInstanceDefinition))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_InstanceDefinition* idef = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_INSTANCE_DEFINITION_RECORD )
    {
      Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        idef = ON_InstanceDefinition::Cast(p);
        if ( !idef )
          delete p;
      }
      if (!idef) {
        ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
    }
    EndRead3dmChunk();
  }
  if (idef)
  {
    Internal_Read3dmUpdateManifest(*idef);
  }
  *ppInstanceDefinition = idef;
  return (idef) ? 1 : 0;
}